

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

void tag_eval(mdl_t *mdl,double *te,double *se)

{
  uint32_t size;
  uint32_t batch;
  long lVar1;
  void **ud;
  uint W_00;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uStack_90;
  void *pvStack_88;
  void **local_80;
  dat_t *local_78;
  uint local_6c;
  long lStack_68;
  uint32_t w_1;
  uint64_t serr;
  uint64_t scnt;
  uint64_t terr;
  uint64_t tcnt;
  ulong uStack_40;
  uint32_t w;
  unsigned_long __vla_expr0;
  dat_t *local_30;
  dat_t *dat;
  double *pdStack_20;
  uint32_t W;
  double *se_local;
  double *te_local;
  mdl_t *mdl_local;
  
  te_local = (double *)mdl;
  se_local = te;
  pdStack_20 = se;
  dat._4_4_ = mdl->opt->nthread;
  if (mdl->devel == (dat_t *)0x0) {
    local_78 = mdl->train;
  }
  else {
    local_78 = mdl->devel;
  }
  local_30 = local_78;
  __vla_expr0 = (unsigned_long)&pvStack_88;
  lVar1 = -((ulong)dat._4_4_ * 8 + 0xf & 0xfffffffffffffff0);
  local_80 = (void **)((long)&pvStack_88 + lVar1);
  uStack_40 = (ulong)dat._4_4_;
  for (tcnt._4_4_ = 0; W_00 = dat._4_4_, ud = local_80, tcnt._4_4_ < dat._4_4_;
      tcnt._4_4_ = tcnt._4_4_ + 1) {
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x109331;
    pvVar2 = xmalloc(*(size_t *)((long)&local_80 + lVar1));
    local_80[tcnt._4_4_] = pvVar2;
    *(double **)local_80[tcnt._4_4_] = te_local;
    *(dat_t **)((long)local_80[tcnt._4_4_] + 8) = local_30;
  }
  size = local_30->nseq;
  batch = *(uint32_t *)((long)*te_local + 0x60);
  *(undefined8 *)((long)&uStack_90 + lVar1) = 0x10938c;
  mth_spawn(tag_evalsub,W_00,ud,size,batch);
  terr = 0;
  scnt = 0;
  serr = 0;
  lStack_68 = 0;
  for (local_6c = 0; local_6c < dat._4_4_; local_6c = local_6c + 1) {
    terr = *(long *)((long)local_80[local_6c] + 0x10) + terr;
    scnt = *(long *)((long)local_80[local_6c] + 0x18) + scnt;
    serr = *(long *)((long)local_80[local_6c] + 0x20) + serr;
    lStack_68 = *(long *)((long)local_80[local_6c] + 0x28) + lStack_68;
    pvVar2 = local_80[local_6c];
    *(undefined8 *)((long)&uStack_90 + lVar1) = 0x109417;
    free(pvVar2);
  }
  auVar3._8_4_ = (int)(scnt >> 0x20);
  auVar3._0_8_ = scnt;
  auVar3._12_4_ = 0x45300000;
  auVar5._8_4_ = (int)(terr >> 0x20);
  auVar5._0_8_ = terr;
  auVar5._12_4_ = 0x45300000;
  *se_local = (((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)scnt) - 4503599627370496.0)) /
              ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)terr) - 4503599627370496.0))) * 100.0;
  auVar4._8_4_ = (int)((ulong)lStack_68 >> 0x20);
  auVar4._0_8_ = lStack_68;
  auVar4._12_4_ = 0x45300000;
  auVar6._8_4_ = (int)(serr >> 0x20);
  auVar6._0_8_ = serr;
  auVar6._12_4_ = 0x45300000;
  *pdStack_20 = (((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lStack_68) - 4503599627370496.0)) /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)serr) - 4503599627370496.0))) * 100.0;
  return;
}

Assistant:

void tag_eval(mdl_t *mdl, double *te, double *se) {
	const uint32_t W = mdl->opt->nthread;
	dat_t *dat = (mdl->devel == NULL) ? mdl->train : mdl->devel;
	// First we prepare the eval state for all the workers threads, we just
	// have to give them the model and dataset to use. This state will be
	// used to retrieve partial result they computed.
	eval_t *eval[W];
	for (uint32_t w = 0; w < W; w++) {
		eval[w] = xmalloc(sizeof(eval_t));
		eval[w]->mdl = mdl;
		eval[w]->dat = dat;
	}
	// And next, we call the workers to do the job and reduce the partial
	// result by summing them and computing the final error rates.
	mth_spawn((func_t *)tag_evalsub, W, (void *)eval, dat->nseq,
		mdl->opt->jobsize);
	uint64_t tcnt = 0, terr = 0;
	uint64_t scnt = 0, serr = 0;
	for (uint32_t w = 0; w < W; w++) {
		tcnt += eval[w]->tcnt;
		terr += eval[w]->terr;
		scnt += eval[w]->scnt;
		serr += eval[w]->serr;
		free(eval[w]);
	}
	*te = (double)terr / tcnt * 100.0;
	*se = (double)serr / scnt * 100.0;
}